

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::PlasticMaterial::readFrom(PlasticMaterial *this,BinaryReader *binary)

{
  Material::readFrom(&this->super_Material,binary);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_kd);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_ks);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->kd);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->ks);
  BinaryReader::read<float,void>(binary,&this->roughness);
  BinaryReader::read<bool,void>(binary,&this->remapRoughness);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_roughness);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_bump);
  return;
}

Assistant:

void PlasticMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(map_kd);
    binary.read(map_ks);
    binary.read(kd);
    binary.read(ks);
    binary.read(roughness);
    binary.read(remapRoughness);
    binary.read(map_roughness);
    binary.read(map_bump);
  }